

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,ModuleFieldType type,string_view name)

{
  SymbolSet *set;
  long *plVar1;
  long *plVar2;
  undefined4 in_register_00000014;
  string *unique;
  string *psVar3;
  char *pcVar4;
  string_view wasm_name;
  string_view sVar5;
  string_view name_00;
  string_view proposed_name;
  string *c_name;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  sVar5._M_str._4_4_ = in_register_00000014;
  sVar5._M_str._0_4_ = type;
  psVar3 = (string *)name._M_str;
  if ((int)type < 0x7f) {
    sVar5._M_len = (size_t)psVar3;
    c_name = psVar3;
    sVar5 = anon_unknown_0::StripLeadingDollar((anon_unknown_0 *)name._M_len,sVar5);
    name_00._M_len = sVar5._M_str;
    name_00._M_str = (char *)0x0;
    Mangle_abi_cxx11_(&local_50,(CWriter *)sVar5._M_len,name_00,SUB81(psVar3,0));
    pcVar4 = (char *)0x4;
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f0364);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*plVar1;
    }
    set = (SymbolSet *)plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    proposed_name._M_str = pcVar4;
    proposed_name._M_len = (size_t)local_70;
    anon_unknown_0::CWriter::FindUniqueName
              (__return_storage_ptr__,(CWriter *)(this + 0x158),set,proposed_name);
    wasm_name._M_str = (char *)__return_storage_ptr__;
    wasm_name._M_len = (size_t)c_name;
    anon_unknown_0::CWriter::ClaimName
              ((CWriter *)(this + 0x158),(SymbolSet *)(this + 0x98),
               (SymbolMap *)(ulong)(uint)(int)(char)((char)type + 'a'),(char)name._M_len,wasm_name,
               c_name);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("static_cast<std::underlying_type<ModuleFieldType>::type>(type) < std::numeric_limits<char>::max()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x2a3,
                "static char wabt::(anonymous namespace)::CWriter::MangleField(ModuleFieldType)");
}

Assistant:

constexpr char CWriter::MangleField(ModuleFieldType type) {
  assert(static_cast<std::underlying_type<ModuleFieldType>::type>(type) <
         std::numeric_limits<char>::max());
  return 'a' + static_cast<char>(type);
}